

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O0

btMatrix3x3 * __thiscall btMatrix3x3::operator+=(btMatrix3x3 *this,btMatrix3x3 *m)

{
  float fVar1;
  btScalar *pbVar2;
  btVector3 *in_RSI;
  btMatrix3x3 *in_RDI;
  btScalar *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  btScalar bVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar bVar7;
  btScalar bVar8;
  btScalar bVar9;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  btVector3 *local_18;
  
  local_18 = in_RSI;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el);
  bVar3 = *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  local_1c = bVar3 + *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el);
  fVar1 = pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  local_20 = fVar1 + pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el);
  fVar1 = pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  local_24 = fVar1 + pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 1);
  bVar4 = *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(local_18 + 1);
  local_28 = bVar4 + *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 1);
  bVar5 = pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(local_18 + 1);
  local_2c = bVar5 + pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 1);
  bVar6 = pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(local_18 + 1);
  local_30 = bVar6 + pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 2);
  bVar7 = *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(local_18 + 2);
  local_34 = bVar7 + *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 2);
  bVar8 = pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(local_18 + 2);
  local_38 = bVar8 + pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI->m_el + 2);
  bVar9 = pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(local_18 + 2);
  local_3c = bVar9 + pbVar2[2];
  setValue((btMatrix3x3 *)CONCAT44(bVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
           &local_3c,&local_38,&local_34,&local_30,(btScalar *)CONCAT44(bVar5,bVar4),
           (btScalar *)CONCAT44(bVar7,bVar6),(btScalar *)CONCAT44(bVar9,bVar8),(btScalar *)in_RDI);
  return in_RDI;
}

Assistant:

SIMD_FORCE_INLINE btMatrix3x3& 
btMatrix3x3::operator+=(const btMatrix3x3& m)
{
#if (defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE))|| defined (BT_USE_NEON)
    m_el[0].mVec128 = m_el[0].mVec128 + m.m_el[0].mVec128;
    m_el[1].mVec128 = m_el[1].mVec128 + m.m_el[1].mVec128;
    m_el[2].mVec128 = m_el[2].mVec128 + m.m_el[2].mVec128;
#else
	setValue(
		m_el[0][0]+m.m_el[0][0], 
		m_el[0][1]+m.m_el[0][1],
		m_el[0][2]+m.m_el[0][2],
		m_el[1][0]+m.m_el[1][0], 
		m_el[1][1]+m.m_el[1][1],
		m_el[1][2]+m.m_el[1][2],
		m_el[2][0]+m.m_el[2][0], 
		m_el[2][1]+m.m_el[2][1],
		m_el[2][2]+m.m_el[2][2]);
#endif
	return *this;
}